

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

RPCHelpMan * help(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff9b8;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  RPCResults *in_stack_fffffffffffff9e0;
  allocator_type *in_stack_fffffffffffff9f0;
  allocator<char> *in_stack_fffffffffffff9f8;
  iterator in_stack_fffffffffffffa00;
  RPCArgOptions *in_stack_fffffffffffffa08;
  string *in_stack_fffffffffffffa10;
  Fallback *in_stack_fffffffffffffa18;
  undefined1 skip_type_check;
  RPCExamples *pRVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffa20;
  RPCExamples *pRVar3;
  string *in_stack_fffffffffffffa28;
  RPCArg *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  Type type;
  undefined1 *puVar4;
  RPCResult *in_stack_fffffffffffffa40;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  RPCHelpMan *name;
  RPCHelpMan *in_stack_fffffffffffffb28;
  allocator<char> local_4a9;
  pointer local_4a8;
  pointer pRStack_4a0;
  pointer local_498;
  allocator<char> local_48a;
  allocator<char> local_489 [31];
  allocator<char> local_46a;
  allocator<char> local_469 [30];
  allocator<char> local_44b;
  allocator<char> local_44a;
  allocator<char> local_449 [31];
  allocator<char> local_42a;
  allocator<char> local_429 [73];
  pointer in_stack_fffffffffffffc20;
  undefined1 local_368 [272];
  undefined1 local_258 [40];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined1 local_217;
  RPCExamples local_150 [8];
  RPCExamples local_48 [2];
  long local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_258[0] = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff9d0);
  local_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9b8);
  local_218 = 0;
  local_217 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                 (Type)((ulong)in_stack_fffffffffffffa20 >> 0x20),in_stack_fffffffffffffa18,
                 in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffa18 >> 0x38);
  pRVar3 = local_150;
  results_00 = (RPCResults *)0x1;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff9b8);
  __l._M_len = (size_type)in_stack_fffffffffffffa08;
  __l._M_array = in_stack_fffffffffffffa00;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff9f8,__l,
             in_stack_fffffffffffff9f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_489[1] = (allocator<char>)0x0;
  local_489[2] = (allocator<char>)0x0;
  local_489[3] = (allocator<char>)0x0;
  local_489[4] = (allocator<char>)0x0;
  local_489[5] = (allocator<char>)0x0;
  local_489[6] = (allocator<char>)0x0;
  local_489[7] = (allocator<char>)0x0;
  local_489[8] = (allocator<char>)0x0;
  local_489[9] = (allocator<char>)0x0;
  local_489[10] = (allocator<char>)0x0;
  local_489[0xb] = (allocator<char>)0x0;
  local_489[0xc] = (allocator<char>)0x0;
  local_489[0xd] = (allocator<char>)0x0;
  local_489[0xe] = (allocator<char>)0x0;
  local_489[0xf] = (allocator<char>)0x0;
  local_489[0x10] = (allocator<char>)0x0;
  local_489[0x11] = (allocator<char>)0x0;
  local_489[0x12] = (allocator<char>)0x0;
  local_489[0x13] = (allocator<char>)0x0;
  local_489[0x14] = (allocator<char>)0x0;
  local_489[0x15] = (allocator<char>)0x0;
  local_489[0x16] = (allocator<char>)0x0;
  local_489[0x17] = (allocator<char>)0x0;
  local_489[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffa40,type,&in_stack_fffffffffffffa30->m_names,
             in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_4a8 = (pointer)0x0;
  pRStack_4a0 = (pointer)0x0;
  local_498 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffa40,type,&in_stack_fffffffffffffa30->m_names,
             in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,(bool)skip_type_check);
  results._M_len = (size_type)in_stack_fffffffffffffa08;
  results._M_array = (iterator)in_stack_fffffffffffffa00;
  RPCResults::RPCResults(in_stack_fffffffffffff9e0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff9b8,(string *)0x13e2b5d);
  this = (RPCArg *)&stack0xfffffffffffffb30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<help()::__0,void>
            (in_stack_fffffffffffff9c8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff9c0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffb28,&name->m_name,in_stack_fffffffffffffb18,
             in_stack_fffffffffffffb10,results_00,pRVar3,(RPCMethodImpl *)in_stack_fffffffffffffc20)
  ;
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4a9);
  RPCResults::~RPCResults((RPCResults *)this);
  puVar4 = local_368;
  puVar1 = local_258;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_489);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_46a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_469);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff9c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  pRVar3 = local_150;
  pRVar2 = local_48;
  do {
    pRVar2 = (RPCExamples *)((long)&pRVar2[-9].m_examples.field_2 + 8);
    RPCArg::~RPCArg(this);
  } while (pRVar2 != pRVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_44b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_44a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_449);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_42a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_429);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan help()
{
    return RPCHelpMan{"help",
                "\nList all commands, or get help for a specified command.\n",
                {
                    {"command", RPCArg::Type::STR, RPCArg::DefaultHint{"all commands"}, "The command to get help on"},
                },
                {
                    RPCResult{RPCResult::Type::STR, "", "The help text"},
                    RPCResult{RPCResult::Type::ANY, "", ""},
                },
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& jsonRequest) -> UniValue
{
    std::string strCommand;
    if (jsonRequest.params.size() > 0) {
        strCommand = jsonRequest.params[0].get_str();
    }
    if (strCommand == "dump_all_command_conversions") {
        // Used for testing only, undocumented
        return tableRPC.dumpArgMap(jsonRequest);
    }

    return tableRPC.help(strCommand, jsonRequest);
},
    };
}